

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void lzma_next_end(lzma_next_coder *next,lzma_allocator *allocator)

{
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  if (next->init != 0) {
    if (next->end == (lzma_end_function)0x0) {
      lzma_free(next->coder,allocator);
    }
    else {
      (*next->end)(next->coder,allocator);
    }
    memcpy(next,&LZMA_NEXT_CODER_INIT,0x40);
  }
  return;
}

Assistant:

extern void
lzma_next_end(lzma_next_coder *next, lzma_allocator *allocator)
{
	if (next->init != (uintptr_t)(NULL)) {
		// To avoid tiny end functions that simply call
		// lzma_free(coder, allocator), we allow leaving next->end
		// NULL and call lzma_free() here.
		if (next->end != NULL)
			next->end(next->coder, allocator);
		else
			lzma_free(next->coder, allocator);

		// Reset the variables so the we don't accidentally think
		// that it is an already initialized coder.
		*next = LZMA_NEXT_CODER_INIT;
	}

	return;
}